

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O0

void RunThread(_func_void *fn)

{
  thread local_18;
  _func_void *local_10;
  _func_void *fn_local;
  
  local_10 = fn;
  std::thread::thread<void(*&)(),,void>(&local_18,&local_10);
  std::thread::join();
  std::thread::~thread(&local_18);
  return;
}

Assistant:

void RunThread(void (*fn)()) {
    std::thread{fn}.join();
  }